

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

void __thiscall groundupdb::HashedValue::HashedValue(HashedValue *this,EncodedValue *from)

{
  bool bVar1;
  size_t sVar2;
  EncodedValue *from_local;
  HashedValue *this_local;
  
  this->_vptr_HashedValue = (_func_int **)&PTR__HashedValue_002c66f8;
  bVar1 = EncodedValue::hasValue(from);
  this->m_has_value = bVar1;
  EncodedValue::data(&this->m_data,from);
  sVar2 = EncodedValue::length(from);
  this->m_length = sVar2;
  sVar2 = EncodedValue::hash(from);
  this->m_hash = sVar2;
  return;
}

Assistant:

HashedValue::HashedValue(const EncodedValue& from)
  : m_has_value(from.hasValue()),
    m_data(from.data()),
    m_length(from.length()),
    m_hash(from.hash())
{
  ;
}